

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WhereExplainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  WhereLoop *pWVar4;
  Vdbe *pVVar5;
  Index *pIVar6;
  uint uVar7;
  char *pcVar9;
  SrcItem *pSVar10;
  uint iTerm;
  char *zFormat;
  bool bVar11;
  StrAccum local_c8;
  SrcItem *local_a8;
  Vdbe *local_a0;
  char zBuf [100];
  Parse *pPVar8;
  
  pPVar8 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar8 = pParse;
  }
  if (pPVar8->explain != '\x02') goto LAB_001a88e5;
  pWVar4 = pLevel->pWLoop;
  uVar7 = pWVar4->wsFlags;
  if (((uVar7 >> 0xd & 1) != 0) || ((wctrlFlags & 0x20) != 0)) goto LAB_001a88e5;
  bVar1 = pLevel->iFrom;
  pSVar10 = pTabList->a + bVar1;
  local_c8.db = pParse->db;
  bVar11 = true;
  if (((uVar7 & 0x30) == 0) && (((uVar7 >> 10 & 1) != 0 || ((pWVar4->u).btree.nEq == 0)))) {
    bVar11 = (wctrlFlags & 3) != 0;
  }
  pVVar5 = pParse->pVdbe;
  local_c8.zText = zBuf;
  local_c8.nAlloc = 100;
  local_c8.mxAlloc = 1000000000;
  local_c8.nChar = 0;
  local_c8.accError = '\0';
  local_c8.printfFlags = '\x01';
  pcVar9 = "SCAN";
  if (bVar11) {
    pcVar9 = "SEARCH";
  }
  sqlite3_str_appendf(&local_c8,"%s %S",pcVar9,pSVar10);
  local_a8 = pSVar10;
  local_a0 = pVVar5;
  if ((uVar7 & 0x500) == 0) {
    pIVar6 = (pWVar4->u).btree.pIndex;
    if ((((pTabList->a[bVar1].pTab)->tabFlags & 0x80) == 0) ||
       ((*(ushort *)&pIVar6->field_0x63 & 3) != 2)) {
      if ((uVar7 >> 0x11 & 1) == 0) {
        if ((uVar7 >> 0xe & 1) == 0) {
          pcVar9 = "COVERING INDEX %s";
          if ((uVar7 & 0x40) == 0) {
            pcVar9 = "INDEX %s";
          }
        }
        else {
          pcVar9 = "AUTOMATIC COVERING INDEX";
        }
      }
      else {
        pcVar9 = "AUTOMATIC PARTIAL COVERING INDEX";
      }
    }
    else {
      if (!bVar11) goto LAB_001a8894;
      pcVar9 = "PRIMARY KEY";
    }
    sqlite3_str_append(&local_c8," USING ",7);
    sqlite3_str_appendf(&local_c8,pcVar9,pIVar6->zName);
    pIVar6 = (pWVar4->u).btree.pIndex;
    uVar2 = (pWVar4->u).btree.nEq;
    uVar3 = pWVar4->nSkip;
    if ((uVar2 != 0) || ((pWVar4->wsFlags & 0x30) != 0)) {
      sqlite3_str_append(&local_c8," (",2);
      for (uVar7 = 0; iTerm = (uint)uVar2, iTerm != uVar7; uVar7 = uVar7 + 1) {
        pcVar9 = explainIndexColumnName(pIVar6,uVar7);
        if (uVar7 != 0) {
          sqlite3_str_append(&local_c8," AND ",5);
        }
        zFormat = "%s=?";
        if (uVar7 < uVar3) {
          zFormat = "ANY(%s)";
        }
        sqlite3_str_appendf(&local_c8,zFormat,pcVar9);
      }
      uVar7 = pWVar4->wsFlags;
      if ((uVar7 & 0x20) != 0) {
        explainAppendTerm(&local_c8,pIVar6,(uint)(pWVar4->u).btree.nBtm,iTerm,iTerm,">");
        uVar7 = pWVar4->wsFlags;
        iTerm = 1;
      }
      if ((uVar7 & 0x10) != 0) {
        explainAppendTerm(&local_c8,pIVar6,(uint)(pWVar4->u).btree.nTop,(uint)uVar2,iTerm,"<");
      }
      sqlite3_str_append(&local_c8,")",1);
    }
  }
  else if ((uVar7 & 0xf) == 0 || (uVar7 >> 8 & 1) == 0) {
    if ((uVar7 >> 10 & 1) != 0) {
      sqlite3_str_appendf(&local_c8," VIRTUAL TABLE INDEX %d:%s",
                          (ulong)(uint)(pWVar4->u).vtab.idxNum,(pWVar4->u).btree.pIndex);
    }
  }
  else {
    sqlite3_str_appendf(&local_c8," USING INTEGER PRIMARY KEY (%s","rowid");
    if ((uVar7 & 5) == 0) {
      if ((uVar7 & 0x30) == 0x30) {
        sqlite3_str_appendf(&local_c8,">? AND %s","rowid");
        uVar7 = 0x3c;
      }
      else {
        uVar7 = (uVar7 & 0x20) >> 4 | 0x3c;
      }
    }
    else {
      uVar7 = 0x3d;
    }
    sqlite3_str_appendf(&local_c8,"%c?)",uVar7);
  }
LAB_001a8894:
  if (((local_a8->fg).jointype & 8) != 0) {
    sqlite3_str_appendf(&local_c8," LEFT-JOIN");
  }
  pcVar9 = sqlite3StrAccumFinish(&local_c8);
  uVar7 = sqlite3VdbeAddOp4(local_a0,0xb9,local_a0->nOp,pParse->addrExplain,0,pcVar9,-6);
  pPVar8 = (Parse *)(ulong)uVar7;
LAB_001a88e5:
  return (int)pPVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  int ret = 0;
#if !defined(SQLITE_DEBUG) && !defined(SQLITE_ENABLE_STMT_SCANSTATUS)
  if( sqlite3ParseToplevel(pParse)->explain==2 )
#endif
  {
    SrcItem *pItem = &pTabList->a[pLevel->iFrom];
    Vdbe *v = pParse->pVdbe;      /* VM being constructed */
    sqlite3 *db = pParse->db;     /* Database handle */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */
    WhereLoop *pLoop;             /* The controlling WhereLoop object */
    u32 flags;                    /* Flags that describe this loop */
    char *zMsg;                   /* Text to add to EQP output */
    StrAccum str;                 /* EQP output string */
    char zBuf[100];               /* Initial space for EQP output string */

    pLoop = pLevel->pWLoop;
    flags = pLoop->wsFlags;
    if( (flags&WHERE_MULTI_OR) || (wctrlFlags&WHERE_OR_SUBCLAUSE) ) return 0;

    isSearch = (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
            || ((flags&WHERE_VIRTUALTABLE)==0 && (pLoop->u.btree.nEq>0))
            || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
    str.printfFlags = SQLITE_PRINTF_INTERNAL;
    sqlite3_str_appendf(&str, "%s %S", isSearch ? "SEARCH" : "SCAN", pItem);
    if( (flags & (WHERE_IPK|WHERE_VIRTUALTABLE))==0 ){
      const char *zFmt = 0;
      Index *pIdx;

      assert( pLoop->u.btree.pIndex!=0 );
      pIdx = pLoop->u.btree.pIndex;
      assert( !(flags&WHERE_AUTO_INDEX) || (flags&WHERE_IDX_ONLY) );
      if( !HasRowid(pItem->pTab) && IsPrimaryKeyIndex(pIdx) ){
        if( isSearch ){
          zFmt = "PRIMARY KEY";
        }
      }else if( flags & WHERE_PARTIALIDX ){
        zFmt = "AUTOMATIC PARTIAL COVERING INDEX";
      }else if( flags & WHERE_AUTO_INDEX ){
        zFmt = "AUTOMATIC COVERING INDEX";
      }else if( flags & WHERE_IDX_ONLY ){
        zFmt = "COVERING INDEX %s";
      }else{
        zFmt = "INDEX %s";
      }
      if( zFmt ){
        sqlite3_str_append(&str, " USING ", 7);
        sqlite3_str_appendf(&str, zFmt, pIdx->zName);
        explainIndexRange(&str, pLoop);
      }
    }else if( (flags & WHERE_IPK)!=0 && (flags & WHERE_CONSTRAINT)!=0 ){
      char cRangeOp;
#if 0  /* Better output, but breaks many tests */
      const Table *pTab = pItem->pTab;
      const char *zRowid = pTab->iPKey>=0 ? pTab->aCol[pTab->iPKey].zCnName:
                              "rowid";
#else
      const char *zRowid = "rowid";
#endif
      sqlite3_str_appendf(&str, " USING INTEGER PRIMARY KEY (%s", zRowid);
      if( flags&(WHERE_COLUMN_EQ|WHERE_COLUMN_IN) ){
        cRangeOp = '=';
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        sqlite3_str_appendf(&str, ">? AND %s", zRowid);
        cRangeOp = '<';
      }else if( flags&WHERE_BTM_LIMIT ){
        cRangeOp = '>';
      }else{
        assert( flags&WHERE_TOP_LIMIT);
        cRangeOp = '<';
      }
      sqlite3_str_appendf(&str, "%c?)", cRangeOp);
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_str_appendf(&str, " VIRTUAL TABLE INDEX %d:%s",
                  pLoop->u.vtab.idxNum, pLoop->u.vtab.idxStr);
    }
#endif
    if( pItem->fg.jointype & JT_LEFT ){
      sqlite3_str_appendf(&str, " LEFT-JOIN");
    }
#ifdef SQLITE_EXPLAIN_ESTIMATED_ROWS
    if( pLoop->nOut>=10 ){
      sqlite3_str_appendf(&str, " (~%llu rows)",
             sqlite3LogEstToInt(pLoop->nOut));
    }else{
      sqlite3_str_append(&str, " (~1 row)", 9);
    }
#endif
    zMsg = sqlite3StrAccumFinish(&str);
    sqlite3ExplainBreakpoint("",zMsg);
    ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                            pParse->addrExplain, 0, zMsg,P4_DYNAMIC);
  }
  return ret;
}